

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O1

void __thiscall CVmObjDict::set_comparator_type(CVmObjDict *this,vm_obj_id_t obj)

{
  int iVar1;
  char *pcVar2;
  
  if (obj == 0) {
    pcVar2 = (this->super_CVmObject).ext_;
    pcVar2[0x30] = '\0';
    pcVar2[0x31] = '\0';
    pcVar2[0x32] = '\0';
    pcVar2[0x33] = '\0';
  }
  else {
    iVar1 = (**(code **)(*(long *)&G_obj_table_X.pages_[obj >> 0xc][obj & 0xfff].ptr_ + 8))
                      (G_obj_table_X.pages_[obj >> 0xc] + (obj & 0xfff),
                       CVmObjStrComp::metaclass_reg_);
    pcVar2 = (this->super_CVmObject).ext_;
    if (iVar1 == 0) {
      pcVar2[0x30] = '\x02';
      pcVar2[0x31] = '\0';
      pcVar2[0x32] = '\0';
      pcVar2[0x33] = '\0';
    }
    else {
      pcVar2[0x30] = '\x01';
      pcVar2[0x31] = '\0';
      pcVar2[0x32] = '\0';
      pcVar2[0x33] = '\0';
    }
  }
  if (obj == 0) {
    pcVar2 = (char *)0x0;
  }
  else {
    pcVar2 = (G_obj_table_X.pages_[obj >> 0xc]->ptr_).obj_ + (obj & 0xfff) * 0x18;
  }
  *(char **)((this->super_CVmObject).ext_ + 0x28) = pcVar2;
  return;
}

Assistant:

void CVmObjDict::set_comparator_type(VMG_ vm_obj_id_t obj)
{
    /* check what kind of object we have */
    if (obj == VM_INVALID_OBJ)
    {
        /* there's no comparator at all, so simply use an exact comparison */
        get_ext()->comparator_type_ = VMDICT_COMP_NONE;
    }
    else if (CVmObjStrComp::is_strcmp_obj(vmg_ obj))
    {
        /* it's a StringComparator */
        get_ext()->comparator_type_ = VMDICT_COMP_STRCOMP;
    }
    else
    {
        /* it's a generic comparator object */
        get_ext()->comparator_type_ = VMDICT_COMP_GENERIC;
    }